

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

double __thiscall tetgenmesh::tetaspectratio(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  double dVar1;
  double local_2c0;
  int local_2b0;
  int local_2ac;
  int j;
  int i;
  int indx [4];
  double minheightinv;
  double volume;
  double H [4];
  double local_260;
  double D;
  double rhs [4];
  double A [4] [4];
  double N [4] [3];
  double vdc [3];
  double dStack_138;
  double vdb [3];
  double dStack_118;
  double vda [3];
  double longlen;
  double edgelength [6];
  double V [6] [3];
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  V[5][2] = (double)pd;
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    edgelength[(long)local_2ac + 5] = pa[local_2ac] - pd[local_2ac];
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    V[0][(long)local_2ac + 2] = pb[local_2ac] - pd[local_2ac];
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    V[1][(long)local_2ac + 2] = pc[local_2ac] - pd[local_2ac];
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    V[2][(long)local_2ac + 2] = pb[local_2ac] - pa[local_2ac];
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    V[3][(long)local_2ac + 2] = pc[local_2ac] - pb[local_2ac];
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    V[4][(long)local_2ac + 2] = pa[local_2ac] - pc[local_2ac];
  }
  for (local_2ac = 0; local_2ac < 6; local_2ac = local_2ac + 1) {
    dVar1 = dot(this,V[(long)local_2ac + -1] + 2,V[(long)local_2ac + -1] + 2);
    edgelength[(long)local_2ac + -1] = dVar1;
  }
  vda[2] = longlen;
  for (local_2ac = 1; local_2ac < 6; local_2ac = local_2ac + 1) {
    if (edgelength[(long)local_2ac + -1] <= vda[2]) {
      local_2c0 = vda[2];
    }
    else {
      local_2c0 = edgelength[(long)local_2ac + -1];
    }
    vda[2] = local_2c0;
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    dVar1 = pa[local_2ac] - *(double *)((long)V[5][2] + (long)local_2ac * 8);
    vda[(long)local_2ac + -1] = dVar1;
    rhs[(long)local_2ac + 3] = dVar1;
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    dVar1 = pb[local_2ac] - *(double *)((long)V[5][2] + (long)local_2ac * 8);
    vdb[(long)local_2ac + -1] = dVar1;
    A[0][(long)local_2ac + 3] = dVar1;
  }
  for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
    dVar1 = pc[local_2ac] - *(double *)((long)V[5][2] + (long)local_2ac * 8);
    vdc[(long)local_2ac + -1] = dVar1;
    A[1][(long)local_2ac + 3] = dVar1;
  }
  lu_decmp(this,(double (*) [4])(rhs + 3),3,&j,&local_260,0);
  dVar1 = (A[(long)j + -1][3] * A[i][0] * A[indx[0]][1]) / 6.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    for (local_2b0 = 0; local_2b0 < 3; local_2b0 = local_2b0 + 1) {
      for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
        rhs[(long)local_2ac + -1] = 0.0;
      }
      rhs[(long)local_2b0 + -1] = 1.0;
      lu_solve(this,(double (*) [4])(rhs + 3),3,&j,&D,0);
      for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
        N[(long)local_2b0 + -1][(long)local_2ac + 2] = rhs[(long)local_2ac + -1];
      }
    }
    for (local_2ac = 0; local_2ac < 3; local_2ac = local_2ac + 1) {
      vdc[(long)local_2ac + -4] =
           (-N[-1][(long)local_2ac + 2] - vdc[(long)local_2ac + -10]) - vdc[(long)local_2ac + -7];
    }
    for (local_2ac = 0; local_2ac < 4; local_2ac = local_2ac + 1) {
      dVar1 = dot(this,N[(long)local_2ac + -1] + 2,N[(long)local_2ac + -1] + 2);
      dVar1 = sqrt(dVar1);
      H[(long)local_2ac + -1] = dVar1;
    }
    indx._8_8_ = volume;
    for (local_2ac = 1; local_2ac < 4; local_2ac = local_2ac + 1) {
      if ((double)indx._8_8_ < H[(long)local_2ac + -1]) {
        indx._8_8_ = H[(long)local_2ac + -1];
      }
    }
    dVar1 = sqrt(vda[2]);
    this_local = (tetgenmesh *)(dVar1 * (double)indx._8_8_);
  }
  else {
    this_local = (tetgenmesh *)0x6974e718d7d7625a;
  }
  return (double)this_local;
}

Assistant:

REAL tetgenmesh::tetaspectratio(point pa, point pb, point pc, point pd)
{
  REAL V[6][3], edgelength[6], longlen;
  REAL vda[3], vdb[3], vdc[3];
  REAL N[4][3], A[4][4], rhs[4], D;
  REAL H[4], volume, minheightinv;
  int indx[4];
  int i, j; 

  // Set the edge vectors: V[0], ..., V[5]
  for (i = 0; i < 3; i++) V[0][i] = pa[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[1][i] = pb[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[2][i] = pc[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[3][i] = pb[i] - pa[i]; 
  for (i = 0; i < 3; i++) V[4][i] = pc[i] - pb[i]; 
  for (i = 0; i < 3; i++) V[5][i] = pa[i] - pc[i]; 

  // Get the squares of the edge lengths.
  for (i = 0; i < 6; i++) edgelength[i] = dot(V[i], V[i]);

  // Calculate the longest and shortest edge length.
  longlen = edgelength[0];
  for (i = 1; i < 6; i++) {
    longlen  = edgelength[i] > longlen ? edgelength[i] : longlen;
  }

  // Set the matrix A = [vda, vdb, vdc]^T.
  for (i = 0; i < 3; i++) A[0][i] = vda[i] = pa[i] - pd[i];
  for (i = 0; i < 3; i++) A[1][i] = vdb[i] = pb[i] - pd[i];
  for (i = 0; i < 3; i++) A[2][i] = vdc[i] = pc[i] - pd[i];
  // Lu-decompose the matrix A.
  lu_decmp(A, 3, indx, &D, 0);
  // Get the volume of abcd.
  volume = (A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
  // Check if it is zero.
  if (volume == 0.0) return 1.0e+200; // A degenerate tet.

  // Compute the 4 face normals (N[0], ..., N[3]).
  for (j = 0; j < 3; j++) {
    for (i = 0; i < 3; i++) rhs[i] = 0.0;
    rhs[j] = 1.0;  // Positive means the inside direction
    lu_solve(A, 3, indx, rhs, 0);
    for (i = 0; i < 3; i++) N[j][i] = rhs[i];
  }
  // Get the fourth normal by summing up the first three.
  for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
  // Normalized the normals.
  for (i = 0; i < 4; i++) {
    // H[i] is the inverse of the height of its corresponding face.
    H[i] = sqrt(dot(N[i], N[i]));
    // if (H[i] > 0.0) {
    //   for (j = 0; j < 3; j++) N[i][j] /= H[i];
    // }
  }
  // Get the radius of the inscribed sphere.
  // insradius = 1.0 / (H[0] + H[1] + H[2] + H[3]);
  // Get the biggest H[i] (corresponding to the smallest height).
  minheightinv = H[0];
  for (i = 1; i < 4; i++) {
    if (H[i] > minheightinv) minheightinv = H[i];
  }

  return sqrt(longlen) * minheightinv;
}